

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOICompactRewardDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall
TOICompactRewardDecPOMDPDiscrete::TOICompactRewardDecPOMDPDiscrete
          (TOICompactRewardDecPOMDPDiscrete *this,TOICompactRewardDecPOMDPDiscrete *o)

{
  undefined8 uVar1;
  string *in_RDI;
  undefined1 cacheFlatModels;
  string *pf;
  pointer_____offset_0x60___ *this_00;
  DecPOMDPDiscreteInterface *this_01;
  TOIDecPOMDPDiscrete *this_02;
  allocator<char> local_91;
  string local_90 [39];
  undefined1 local_69 [56];
  undefined1 local_31 [49];
  
  this_01 = (DecPOMDPDiscreteInterface *)&in_RDI[0x18]._M_string_length;
  MultiAgentDecisionProcessInterface::MultiAgentDecisionProcessInterface
            ((MultiAgentDecisionProcessInterface *)this_01);
  this_00 = &VTT;
  POSGInterface::POSGInterface((POSGInterface *)this_01,&PTR_PTR_00d3df88);
  DecPOMDPInterface::DecPOMDPInterface
            ((DecPOMDPInterface *)this_01,
             (void **)&(((E *)((long)this_00 + 200))->_m_error).field_2._M_allocated_capacity);
  MultiAgentDecisionProcessDiscreteInterface::MultiAgentDecisionProcessDiscreteInterface
            ((MultiAgentDecisionProcessDiscreteInterface *)
             &in_RDI[0x18].field_2._M_allocated_capacity,
             (void **)&(((E *)((long)this_00 + 0xf0))->_m_error).field_2._M_allocated_capacity);
  DecPOMDPDiscreteInterface::DecPOMDPDiscreteInterface
            (this_01,(void **)&(((E *)((long)this_00 + 0xa0))->_m_error).field_2.
                               _M_allocated_capacity);
  this_02 = (TOIDecPOMDPDiscrete *)local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
             (char *)this_01,(allocator<char> *)this_00);
  pf = (string *)local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
             (char *)this_01,(allocator<char> *)this_00);
  cacheFlatModels = (undefined1)((ulong)&local_91 >> 0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
             (char *)this_01,(allocator<char> *)this_00);
  TOIDecPOMDPDiscrete::TOIDecPOMDPDiscrete
            (this_02,(void **)this_01,(string *)this_00,in_RDI,pf,(bool)cacheFlatModels);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)(local_69 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  *(undefined8 *)in_RDI = 0xd3d6e0;
  in_RDI[0x18]._M_string_length = 0xd3dac0;
  in_RDI[0x18]._M_string_length = 0xd3dac0;
  in_RDI[0x18]._M_string_length = 0xd3dac0;
  in_RDI[0x18]._M_string_length = 0xd3dac0;
  in_RDI[0x18].field_2._M_allocated_capacity = 0xd3dd18;
  *(undefined8 *)(in_RDI + 0x14) = 0xd3d938;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xacae97);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xacaead);
  std::vector<RewardModel_*,_std::allocator<RewardModel_*>_>::vector
            ((vector<RewardModel_*,_std::allocator<RewardModel_*>_> *)0xacaec3);
  uVar1 = __cxa_allocate_exception(0x28);
  E::E((E *)this_00,(char *)in_RDI);
  __cxa_throw(uVar1,&E::typeinfo,E::~E);
}

Assistant:

TOICompactRewardDecPOMDPDiscrete::
TOICompactRewardDecPOMDPDiscrete(const TOICompactRewardDecPOMDPDiscrete& o) 
{
    throw(E("TOICompactRewardDecPOMDPDiscrete: copy ctor not yet implemented"));
}